

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::intThresholdPositionDeviationErrorThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
               bool acceptOutOfBoundsAsAnyValue,int maxAllowedFailingPixels,CompareLogMode logMode)

{
  ostringstream *poVar1;
  int iVar2;
  TextureChannelClass TVar3;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __fd;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  allocator<char> local_49a;
  allocator<char> local_499;
  Vec4 local_498;
  Vec4 local_488;
  string local_470;
  string local_450;
  char *local_430;
  char *local_428;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  LogImageSet local_360;
  LogImage local_320;
  LogImage local_290;
  ConstPixelBufferAccess local_200;
  TextureLevel local_1d8;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_1b0._0_4_ = RGB;
  local_1b0._4_4_ = UNORM_INT8;
  local_430 = imageSetDesc;
  local_428 = imageSetName;
  TextureLevel::TextureLevel
            (&local_1d8,(TextureFormat *)local_1b0,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],(reference->m_size).m_data[2]);
  TextureLevel::getAccess((PixelBufferAccess *)&local_200,&local_1d8);
  iVar2 = anon_unknown_50::findNumPositionDeviationFailingPixels
                    ((PixelBufferAccess *)&local_200,reference,result,threshold,maxPositionDeviation
                     ,acceptOutOfBoundsAsAnyValue);
  local_488.m_data[0] = 0.0;
  local_488.m_data[1] = 0.0;
  local_488.m_data[2] = 0.0;
  local_488.m_data[3] = 0.0;
  local_498.m_data[0] = 1.0;
  local_498.m_data[1] = 1.0;
  local_498.m_data[2] = 1.0;
  local_498.m_data[3] = 1.0;
  __fd = (int)log;
  if (logMode == COMPARE_LOG_EVERYTHING || maxAllowedFailingPixels < iVar2) {
    TVar3 = getTextureChannelClass((reference->m_format).type);
    if ((TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar3 = getTextureChannelClass((result->m_format).type),
       TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(reference,result,&local_498,&local_488);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Result and reference images are normalized with formula p * ",
                 0x3c);
      operator<<((ostream *)poVar1,&local_498);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," + ",3);
      operator<<((ostream *)poVar1,&local_488);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    if (maxAllowedFailingPixels < iVar2) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image comparison failed:\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tallowed position deviation = ",0x1e);
      operator<<((ostream *)poVar1,maxPositionDeviation);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tcolor threshold = ",0x13);
      operator<<((ostream *)poVar1,threshold);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Number of failing pixels = ",0x1b);
    std::ostream::operator<<(poVar1,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", max allowed = ",0x10);
    std::ostream::operator<<(poVar1,maxAllowedFailingPixels);
    MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,local_428,&local_499);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,local_430,&local_49a);
    LogImageSet::LogImageSet(&local_360,&local_450,&local_470);
    TestLog::startImageSet
              (log,local_360.m_name._M_dataplus._M_p,local_360.m_description._M_dataplus._M_p);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Result","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Result","");
    LogImage::LogImage((LogImage *)local_1b0,&local_3e0,&local_400,result,&local_498,&local_488,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)result);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Reference","");
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Reference","");
    LogImage::LogImage(&local_320,&local_420,&local_380,reference,&local_498,&local_488,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_320,__fd,__buf_01,(size_t)reference);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"ErrorMask","");
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Error mask","");
    access = &local_200;
    LogImage::LogImage(&local_290,&local_3a0,&local_3c0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_290,__fd,__buf_02,(size_t)access);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
      operator_delete(local_290.m_description._M_dataplus._M_p,
                      local_290.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
      operator_delete(local_290.m_name._M_dataplus._M_p,
                      local_290.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_description._M_dataplus._M_p != &local_320.m_description.field_2) {
      operator_delete(local_320.m_description._M_dataplus._M_p,
                      local_320.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_name._M_dataplus._M_p != &local_320.m_name.field_2) {
      operator_delete(local_320.m_name._M_dataplus._M_p,
                      local_320.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_description._M_dataplus._M_p != &local_360.m_description.field_2) {
      operator_delete(local_360.m_description._M_dataplus._M_p,
                      local_360.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    local_290.m_name._M_dataplus._M_p = local_450._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p == &local_450.field_2) goto LAB_00310f07;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00310f07;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_498,&local_488);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,local_428,(allocator<char> *)&local_3e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,local_430,(allocator<char> *)&local_400);
    LogImageSet::LogImageSet((LogImageSet *)&local_320,&local_290.m_name,&local_360.m_name);
    TestLog::startImageSet
              (log,local_320.m_name._M_dataplus._M_p,local_320.m_description._M_dataplus._M_p);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Result","");
    LogImage::LogImage((LogImage *)local_1b0,&local_450,&local_470,result,&local_498,&local_488,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf,(size_t)result);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_description._M_dataplus._M_p != &local_320.m_description.field_2) {
      operator_delete(local_320.m_description._M_dataplus._M_p,
                      local_320.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.m_name._M_dataplus._M_p != &local_320.m_name.field_2) {
      operator_delete(local_320.m_name._M_dataplus._M_p,
                      local_320.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    local_450.field_2._M_allocated_capacity = local_290.m_name.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_name._M_dataplus._M_p == &local_290.m_name.field_2) goto LAB_00310f07;
  }
  operator_delete(local_290.m_name._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
LAB_00310f07:
  TextureLevel::~TextureLevel(&local_1d8);
  return iVar2 <= maxAllowedFailingPixels;
}

Assistant:

bool intThresholdPositionDeviationErrorThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue, int maxAllowedFailingPixels, CompareLogMode logMode)
{
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	const int			numFailingPixels	= findNumPositionDeviationFailingPixels(errorMask, reference, result, threshold, maxPositionDeviation, acceptOutOfBoundsAsAnyValue);
	const bool			compareOk			= numFailingPixels <= maxAllowedFailingPixels;
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log	<< TestLog::Message
				<< "Image comparison failed:\n"
				<< "\tallowed position deviation = " << maxPositionDeviation << "\n"
				<< "\tcolor threshold = " << threshold
				<< TestLog::EndMessage;
		log << TestLog::Message << "Number of failing pixels = " << numFailingPixels << ", max allowed = " << maxAllowedFailingPixels << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}